

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoringtable_test.cpp
# Opt level: O1

void __thiscall
TEST_ScoringTableTest_DealerWinByDiscard_TestShell::
~TEST_ScoringTableTest_DealerWinByDiscard_TestShell
          (TEST_ScoringTableTest_DealerWinByDiscard_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(ScoringTableTest, DealerWinByDiscard)
{
	CHECK_EQUAL(1500, t.dealerWinByDiscard(1, 30));
	CHECK_EQUAL(2000, t.dealerWinByDiscard(1, 40));
	CHECK_EQUAL(2400, t.dealerWinByDiscard(1, 50));
	CHECK_EQUAL(2900, t.dealerWinByDiscard(1, 60));
	CHECK_EQUAL(3400, t.dealerWinByDiscard(1, 70));

	CHECK_EQUAL(2000, t.dealerWinByDiscard(2, 20));
	CHECK_EQUAL(2900, t.dealerWinByDiscard(2, 30));
	CHECK_EQUAL(3900, t.dealerWinByDiscard(2, 40));
	CHECK_EQUAL(4800, t.dealerWinByDiscard(2, 50));
	CHECK_EQUAL(5800, t.dealerWinByDiscard(2, 60));
	CHECK_EQUAL(6800, t.dealerWinByDiscard(2, 70));

	CHECK_EQUAL(3900, t.dealerWinByDiscard(3, 20));
	CHECK_EQUAL(5800, t.dealerWinByDiscard(3, 30));
	CHECK_EQUAL(7700, t.dealerWinByDiscard(3, 40));
	CHECK_EQUAL(9600, t.dealerWinByDiscard(3, 50));
	CHECK_EQUAL(11600, t.dealerWinByDiscard(3, 60));

	CHECK_EQUAL(7700, t.dealerWinByDiscard(4, 20));
	CHECK_EQUAL(11600, t.dealerWinByDiscard(4, 30));
}